

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_memory.cpp
# Opt level: O2

void duckdb::DuckDBMemoryFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  _func_int **pp_Var3;
  ulong index;
  _func_int **__n;
  idx_t iVar4;
  _func_int **pp_Var5;
  string local_90;
  Value local_70;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var5 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var5) / 0x18)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var5) / 0x18) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::MemoryInformation,_true>::get<true>
                         ((vector<duckdb::MemoryInformation,_true> *)(pGVar1 + 1),(size_type)__n);
      EnumUtil::ToString<duckdb::MemoryTag>(&local_90,pvVar2->tag);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      iVar4 = pvVar2->size;
      if ((long)iVar4 < 1) {
        iVar4 = 0;
      }
      Value::BIGINT(&local_70,iVar4);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      iVar4 = pvVar2->evicted_data;
      if ((long)iVar4 < 1) {
        iVar4 = 0;
      }
      Value::BIGINT(&local_70,iVar4);
      DataChunk::SetValue(output,2,index,&local_70);
      Value::~Value(&local_70);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var5 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBMemoryFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBMemoryData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// tag, VARCHAR
		output.SetValue(col++, count, EnumUtil::ToString(entry.tag));
		// memory_usage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.size)));
		// temporary_storage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.evicted_data)));
		count++;
	}
	output.SetCardinality(count);
}